

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O0

void mtag(memfile *mf,long tagdata,memfile_tagtype tagtype)

{
  bool bVar1;
  int iVar2;
  memfile_tag *pmVar3;
  mdiff_cmd mVar4;
  int local_2c;
  memfile_tag *pmStack_28;
  int offset;
  memfile_tag *tag;
  int bucket;
  memfile_tagtype tagtype_local;
  long tagdata_local;
  memfile *mf_local;
  
  iVar2 = (int)((tagdata * 0x26b + (long)(int)tagtype) % 0x3f1);
  pmVar3 = (memfile_tag *)malloc(0x18);
  pmVar3->next = mf->tags[iVar2];
  pmVar3->tagdata = tagdata;
  pmVar3->tagtype = tagtype;
  pmVar3->pos = mf->pos;
  mf->tags[iVar2] = pmVar3;
  if (mf->relativeto != (memfile *)0x0) {
    for (pmStack_28 = mf->relativeto->tags[iVar2];
        (pmStack_28 != (memfile_tag *)0x0 &&
        ((pmStack_28->tagtype != tagtype || (pmStack_28->tagdata != tagdata))));
        pmStack_28 = pmStack_28->next) {
    }
    if ((pmStack_28 != (memfile_tag *)0x0) && (mf->relativepos != pmStack_28->pos)) {
      local_2c = mf->relativepos - pmStack_28->pos;
      if (mf->curcmd != MDIFF_SEEK) {
        mdiffflush(mf);
        mf->curcount = 0;
      }
      while( true ) {
        bVar1 = true;
        if (local_2c + mf->curcount < 0x2000) {
          bVar1 = local_2c + mf->curcount < -0x1fff;
        }
        if (!bVar1) break;
        if (local_2c + mf->curcount < 0) {
          mdiffwrite14(mf,MDIFF_SEEK,-0x1fff);
          local_2c = local_2c + 0x1fff;
        }
        else {
          mdiffwrite14(mf,MDIFF_SEEK,0x1fff);
          local_2c = local_2c + -0x1fff;
        }
      }
      mf->curcount = local_2c + mf->curcount;
      mVar4 = MDIFF_INVALID;
      if (mf->curcount != 0) {
        mVar4 = MDIFF_SEEK;
      }
      mf->curcmd = mVar4;
      mf->relativepos = pmStack_28->pos;
    }
  }
  return;
}

Assistant:

void mtag(struct memfile *mf, long tagdata, enum memfile_tagtype tagtype)
{
	/*
	 * 619 is chosen here because it's a prime number, and it's
	 * approximately in the golden ratio with MEMFILE_HASHTABLE_SIZE.
	 */
	int bucket = (tagdata * 619 + (int)tagtype) % MEMFILE_HASHTABLE_SIZE;
	struct memfile_tag *tag = malloc(sizeof(struct memfile_tag));
	tag->next = mf->tags[bucket];
	tag->tagdata = tagdata;
	tag->tagtype = tagtype;
	tag->pos = mf->pos;
	mf->tags[bucket] = tag;

	if (mf->relativeto) {
	    for (tag = mf->relativeto->tags[bucket]; tag; tag = tag->next) {
		if (tag->tagtype == tagtype && tag->tagdata == tagdata)
		    break;
	    }
	    if (tag && mf->relativepos != tag->pos) {
		int offset = mf->relativepos - tag->pos;
		if (mf->curcmd != MDIFF_SEEK) {
		    mdiffflush(mf);
		    mf->curcount = 0;
		}
		while (offset + mf->curcount >=  (1<<13) ||
		       offset + mf->curcount <= -(1<<13)) {
		    if (offset + mf->curcount < 0) {
			mdiffwrite14(mf, MDIFF_SEEK, -0x1fff);
			offset += 0x1fff;
		    } else {
			mdiffwrite14(mf, MDIFF_SEEK, 0x1fff);
			offset -= 0x1fff;
		    }
		}
		mf->curcount += offset;
		mf->curcmd = (mf->curcount ? MDIFF_SEEK : MDIFF_INVALID);
		mf->relativepos = tag->pos;
	    }
	}
}